

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-util.c
# Opt level: O0

void player_leaving(loc_conflict grid1,loc_conflict grid2)

{
  _Bool _Var1;
  wchar_t wVar2;
  loc_conflict grid;
  loc_conflict decoy;
  loc_conflict grid2_local;
  loc_conflict grid1_local;
  
  grid = (loc_conflict)cave_find_decoy(cave);
  _Var1 = loc_is_zero((loc)grid);
  if (!_Var1) {
    wVar2 = distance((loc)grid,(loc)grid2);
    if ((int)(uint)z_info->max_sight < wVar2) {
      square_destroy_decoy((chunk *)cave,grid);
    }
  }
  hit_trap(grid1,L'\x01');
  return;
}

Assistant:

static void player_leaving(struct loc grid1, struct loc grid2)
{
	struct loc decoy = cave_find_decoy(cave);

	/* Decoys get destroyed if player is too far away */
	if (!loc_is_zero(decoy) &&
		distance(decoy, grid2) > z_info->max_sight) {
		square_destroy_decoy(cave, decoy);
	}

	/* Delayed traps trigger when the player leaves. */
	hit_trap(grid1, 1);
}